

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceFieldOptions.hpp
# Opt level: O1

void __thiscall OpenMD::ForceFieldOptions::validateOptions(ForceFieldOptions *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  bool bVar5;
  EqualIgnoreCaseConstraint local_8d0;
  EqualIgnoreCaseConstraint local_890;
  OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint> local_850;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_7b0;
  EqualIgnoreCaseConstraint local_6b0;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_670;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  EqualIgnoreCaseConstraint local_490;
  string local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  if ((this->vdWtype).super_ParameterBase.empty_ == false) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Lennard-Jones","");
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_670,&local_70);
    pcVar4 = (this->vdWtype).data_._M_dataplus._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar4,pcVar4 + (this->vdWtype).data_._M_string_length);
    bVar5 = EqualIgnoreCaseConstraint::operator()((EqualIgnoreCaseConstraint *)&local_670,&local_90)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    paVar3 = &local_670.cons1_.
              super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
              .description_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670.cons1_.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p != paVar3) {
      operator_delete(local_670.cons1_.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_670.cons1_.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &local_670.
              super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
              .description_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p != paVar1) {
      operator_delete(local_670.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_670.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (!bVar5) {
      pcVar4 = (this->vdWtype).super_ParameterBase.keyword_._M_dataplus._M_p;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Lennard-Jones","");
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_670,&local_b0);
      paVar2 = &local_7b0.
                super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                .description_.field_2;
      local_7b0.
      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
      .description_._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7b0,
                 local_670.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p,
                 local_670.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p +
                 local_670.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_string_length);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar4,
               local_7b0.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p != paVar2) {
        operator_delete(local_7b0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_7b0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670.cons1_.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p != paVar3) {
        operator_delete(local_670.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_670.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p != paVar1) {
        operator_delete(local_670.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_670.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->DistanceMixingRule).super_ParameterBase.empty_ == false) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"arithmetic","");
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_850,&local_d0);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"geometric","");
    isEqualIgnoreCase(&local_8d0,&local_f0);
    OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_7b0,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_850,
                       &local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"cubic","");
    isEqualIgnoreCase(&local_890,&local_110);
    OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_670,
                       (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        *)&local_7b0,
                       &local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    pcVar4 = (this->DistanceMixingRule).data_._M_dataplus._M_p;
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar4,
               pcVar4 + (this->DistanceMixingRule).data_._M_string_length);
    bVar5 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_670,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)&local_670);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_890.rhs_._M_dataplus._M_p != &local_890.rhs_.field_2) {
      operator_delete(local_890.rhs_._M_dataplus._M_p,
                      local_890.rhs_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           _M_dataplus._M_p !=
        &local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
         field_2) {
      operator_delete(local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_._M_dataplus._M_p,
                      local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0.cons1_.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_._M_dataplus._M_p !=
        &local_7b0.cons1_.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
         description_.field_2) {
      operator_delete(local_7b0.cons1_.cons2_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      _M_dataplus._M_p,
                      local_7b0.cons1_.cons2_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0.cons1_.cons1_.rhs_._M_dataplus._M_p != &local_7b0.cons1_.cons1_.rhs_.field_2) {
      operator_delete(local_7b0.cons1_.cons1_.rhs_._M_dataplus._M_p,
                      local_7b0.cons1_.cons1_.rhs_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0.cons1_.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_._M_dataplus._M_p !=
        &local_7b0.cons1_.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
         description_.field_2) {
      operator_delete(local_7b0.cons1_.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      _M_dataplus._M_p,
                      local_7b0.cons1_.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0.cons1_.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p !=
        &local_7b0.cons1_.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_.field_2) {
      operator_delete(local_7b0.cons1_.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_7b0.cons1_.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p !=
        &local_7b0.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_.field_2) {
      operator_delete(local_7b0.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_7b0.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d0.rhs_._M_dataplus._M_p != &local_8d0.rhs_.field_2) {
      operator_delete(local_8d0.rhs_._M_dataplus._M_p,
                      local_8d0.rhs_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           _M_dataplus._M_p !=
        &local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
         field_2) {
      operator_delete(local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_._M_dataplus._M_p,
                      local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_._M_dataplus._M_p !=
        &local_850.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
         description_.field_2) {
      operator_delete(local_850.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      _M_dataplus._M_p,
                      local_850.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p !=
        &local_850.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_.field_2) {
      operator_delete(local_850.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_850.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (!bVar5) {
      pcVar4 = (this->DistanceMixingRule).super_ParameterBase.keyword_._M_dataplus._M_p;
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"arithmetic","");
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_850,&local_150);
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"geometric","");
      isEqualIgnoreCase(&local_8d0,&local_170);
      OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_7b0,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_850,
                         &local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"cubic","");
      isEqualIgnoreCase(&local_890,&local_190);
      OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_670,
                         (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                          *)&local_7b0,
                         &local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
      paVar3 = &local_6b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                description_.field_2;
      local_6b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
      _M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_6b0,
                 local_670.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p,
                 local_670.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p +
                 local_670.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_string_length);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar4,
               local_6b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_
               ._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p != paVar3) {
        operator_delete(local_6b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_6b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)&local_670);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_890.rhs_._M_dataplus._M_p != &local_890.rhs_.field_2) {
        operator_delete(local_890.rhs_._M_dataplus._M_p,
                        local_890.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p !=
          &local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           field_2) {
        operator_delete(local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0.cons1_.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
             description_._M_dataplus._M_p !=
          &local_7b0.cons1_.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_.field_2) {
        operator_delete(local_7b0.cons1_.cons2_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        _M_dataplus._M_p,
                        local_7b0.cons1_.cons2_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0.cons1_.cons1_.rhs_._M_dataplus._M_p != &local_7b0.cons1_.cons1_.rhs_.field_2)
      {
        operator_delete(local_7b0.cons1_.cons1_.rhs_._M_dataplus._M_p,
                        local_7b0.cons1_.cons1_.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0.cons1_.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
             description_._M_dataplus._M_p !=
          &local_7b0.cons1_.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_.field_2) {
        operator_delete(local_7b0.cons1_.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        _M_dataplus._M_p,
                        local_7b0.cons1_.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0.cons1_.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_7b0.cons1_.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_7b0.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_7b0.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_7b0.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_7b0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_7b0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8d0.rhs_._M_dataplus._M_p != &local_8d0.rhs_.field_2) {
        operator_delete(local_8d0.rhs_._M_dataplus._M_p,
                        local_8d0.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p !=
          &local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           field_2) {
        operator_delete(local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_850.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
             description_._M_dataplus._M_p !=
          &local_850.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_.field_2) {
        operator_delete(local_850.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        _M_dataplus._M_p,
                        local_850.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_850.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_850.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_850.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_850.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->DistanceType).super_ParameterBase.empty_ == false) {
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"sigma","");
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_7b0,&local_1b0);
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"Rmin","");
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_850,&local_1d0);
    OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_670,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_7b0,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_850);
    pcVar4 = (this->DistanceType).data_._M_dataplus._M_p;
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f0,pcVar4,pcVar4 + (this->DistanceType).data_._M_string_length);
    bVar5 = OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>::
            operator()((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_670,&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670.cons1_.cons1_.cons1_.rhs_._M_dataplus._M_p !=
        &local_670.cons1_.cons1_.cons1_.rhs_.field_2) {
      operator_delete(local_670.cons1_.cons1_.cons1_.rhs_._M_dataplus._M_p,
                      local_670.cons1_.cons1_.cons1_.rhs_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670.cons1_.cons1_.cons1_.
           super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_._M_dataplus.
           _M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&local_670.cons1_.cons1_.cons1_.
                   super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_ +
           0x10U)) {
      operator_delete(local_670.cons1_.cons1_.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      _M_dataplus._M_p,
                      local_670.cons1_.cons1_.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670.cons1_.cons1_.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p !=
        &local_670.cons1_.cons1_.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_.field_2) {
      operator_delete(local_670.cons1_.cons1_.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_670.cons1_.cons1_.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670.cons1_.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p !=
        &local_670.cons1_.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_.field_2) {
      operator_delete(local_670.cons1_.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_670.cons1_.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p !=
        &local_670.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_.field_2) {
      operator_delete(local_670.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_670.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_._M_dataplus._M_p !=
        &local_850.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
         description_.field_2) {
      operator_delete(local_850.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      _M_dataplus._M_p,
                      local_850.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p !=
        &local_850.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_.field_2) {
      operator_delete(local_850.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_850.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0.cons1_.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p !=
        &local_7b0.cons1_.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_.field_2) {
      operator_delete(local_7b0.cons1_.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_7b0.cons1_.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    paVar3 = &local_7b0.
              super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
              .description_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p != paVar3) {
      operator_delete(local_7b0.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_7b0.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if (!bVar5) {
      pcVar4 = (this->DistanceType).super_ParameterBase.keyword_._M_dataplus._M_p;
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"sigma","");
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_7b0,&local_210);
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"Rmin","");
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_850,&local_230);
      OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_670,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_7b0,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_850);
      paVar1 = &local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                description_.field_2;
      local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
      _M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_8d0,
                 local_670.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p,
                 local_670.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p +
                 local_670.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_string_length);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar4,
               local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_
               ._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p != paVar1) {
        operator_delete(local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670.cons1_.cons1_.cons1_.rhs_._M_dataplus._M_p !=
          &local_670.cons1_.cons1_.cons1_.rhs_.field_2) {
        operator_delete(local_670.cons1_.cons1_.cons1_.rhs_._M_dataplus._M_p,
                        local_670.cons1_.cons1_.cons1_.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670.cons1_.cons1_.cons1_.
             super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_._M_dataplus
             ._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&local_670.cons1_.cons1_.cons1_.
                     super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_ +
             0x10U)) {
        operator_delete(local_670.cons1_.cons1_.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        _M_dataplus._M_p,
                        local_670.cons1_.cons1_.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670.cons1_.cons1_.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_670.cons1_.cons1_.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_670.cons1_.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_670.cons1_.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670.cons1_.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_670.cons1_.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_670.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_670.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_670.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_670.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_670.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_850.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
             description_._M_dataplus._M_p !=
          &local_850.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_.field_2) {
        operator_delete(local_850.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        _M_dataplus._M_p,
                        local_850.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_850.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_850.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_850.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_850.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0.cons1_.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_7b0.cons1_.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_7b0.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_7b0.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p != paVar3) {
        operator_delete(local_7b0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_7b0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->EnergyMixingRule).super_ParameterBase.empty_ == false) {
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"arithmetic","");
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_850,&local_250);
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"geometric","");
    isEqualIgnoreCase(&local_8d0,&local_270);
    OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_7b0,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_850,
                       &local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"hhg","");
    isEqualIgnoreCase(&local_890,&local_290);
    OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_670,
                       (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        *)&local_7b0,
                       &local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    pcVar4 = (this->EnergyMixingRule).data_._M_dataplus._M_p;
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b0,pcVar4,pcVar4 + (this->EnergyMixingRule).data_._M_string_length)
    ;
    bVar5 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_670,&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)&local_670);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_890.rhs_._M_dataplus._M_p != &local_890.rhs_.field_2) {
      operator_delete(local_890.rhs_._M_dataplus._M_p,
                      local_890.rhs_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           _M_dataplus._M_p !=
        &local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
         field_2) {
      operator_delete(local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_._M_dataplus._M_p,
                      local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0.cons1_.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_._M_dataplus._M_p !=
        &local_7b0.cons1_.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
         description_.field_2) {
      operator_delete(local_7b0.cons1_.cons2_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      _M_dataplus._M_p,
                      local_7b0.cons1_.cons2_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0.cons1_.cons1_.rhs_._M_dataplus._M_p != &local_7b0.cons1_.cons1_.rhs_.field_2) {
      operator_delete(local_7b0.cons1_.cons1_.rhs_._M_dataplus._M_p,
                      local_7b0.cons1_.cons1_.rhs_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0.cons1_.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_._M_dataplus._M_p !=
        &local_7b0.cons1_.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
         description_.field_2) {
      operator_delete(local_7b0.cons1_.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      _M_dataplus._M_p,
                      local_7b0.cons1_.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0.cons1_.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p !=
        &local_7b0.cons1_.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_.field_2) {
      operator_delete(local_7b0.cons1_.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_7b0.cons1_.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p !=
        &local_7b0.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_.field_2) {
      operator_delete(local_7b0.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_7b0.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d0.rhs_._M_dataplus._M_p != &local_8d0.rhs_.field_2) {
      operator_delete(local_8d0.rhs_._M_dataplus._M_p,
                      local_8d0.rhs_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           _M_dataplus._M_p !=
        &local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
         field_2) {
      operator_delete(local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_._M_dataplus._M_p,
                      local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_._M_dataplus._M_p !=
        &local_850.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
         description_.field_2) {
      operator_delete(local_850.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      _M_dataplus._M_p,
                      local_850.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p !=
        &local_850.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_.field_2) {
      operator_delete(local_850.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_850.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if (!bVar5) {
      pcVar4 = (this->EnergyMixingRule).super_ParameterBase.keyword_._M_dataplus._M_p;
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"arithmetic","");
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_850,&local_2d0);
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"geometric","");
      isEqualIgnoreCase(&local_8d0,&local_2f0);
      OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_7b0,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_850,
                         &local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"hhg","");
      isEqualIgnoreCase(&local_890,&local_310);
      OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_670,
                         (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                          *)&local_7b0,
                         &local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
      paVar3 = &local_6b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                description_.field_2;
      local_6b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
      _M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_6b0,
                 local_670.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p,
                 local_670.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p +
                 local_670.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_string_length);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar4,
               local_6b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_
               ._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p != paVar3) {
        operator_delete(local_6b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_6b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)&local_670);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_890.rhs_._M_dataplus._M_p != &local_890.rhs_.field_2) {
        operator_delete(local_890.rhs_._M_dataplus._M_p,
                        local_890.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p !=
          &local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           field_2) {
        operator_delete(local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0.cons1_.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
             description_._M_dataplus._M_p !=
          &local_7b0.cons1_.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_.field_2) {
        operator_delete(local_7b0.cons1_.cons2_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        _M_dataplus._M_p,
                        local_7b0.cons1_.cons2_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0.cons1_.cons1_.rhs_._M_dataplus._M_p != &local_7b0.cons1_.cons1_.rhs_.field_2)
      {
        operator_delete(local_7b0.cons1_.cons1_.rhs_._M_dataplus._M_p,
                        local_7b0.cons1_.cons1_.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0.cons1_.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
             description_._M_dataplus._M_p !=
          &local_7b0.cons1_.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_.field_2) {
        operator_delete(local_7b0.cons1_.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        _M_dataplus._M_p,
                        local_7b0.cons1_.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0.cons1_.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_7b0.cons1_.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_7b0.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_7b0.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_7b0.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_7b0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_7b0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8d0.rhs_._M_dataplus._M_p != &local_8d0.rhs_.field_2) {
        operator_delete(local_8d0.rhs_._M_dataplus._M_p,
                        local_8d0.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p !=
          &local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           field_2) {
        operator_delete(local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_850.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
             description_._M_dataplus._M_p !=
          &local_850.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_.field_2) {
        operator_delete(local_850.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        _M_dataplus._M_p,
                        local_850.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_850.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_850.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_850.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_850.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->TorsionAngleConvention).super_ParameterBase.empty_ == false) {
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"180_is_trans","");
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_7b0,&local_330);
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"0_is_trans","");
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_850,&local_350);
    OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_670,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_7b0,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_850);
    pcVar4 = (this->TorsionAngleConvention).data_._M_dataplus._M_p;
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_370,pcVar4,
               pcVar4 + (this->TorsionAngleConvention).data_._M_string_length);
    bVar5 = OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>::
            operator()((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_670,&local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670.cons1_.cons1_.cons1_.rhs_._M_dataplus._M_p !=
        &local_670.cons1_.cons1_.cons1_.rhs_.field_2) {
      operator_delete(local_670.cons1_.cons1_.cons1_.rhs_._M_dataplus._M_p,
                      local_670.cons1_.cons1_.cons1_.rhs_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670.cons1_.cons1_.cons1_.
           super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_._M_dataplus.
           _M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&local_670.cons1_.cons1_.cons1_.
                   super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_ +
           0x10U)) {
      operator_delete(local_670.cons1_.cons1_.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      _M_dataplus._M_p,
                      local_670.cons1_.cons1_.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670.cons1_.cons1_.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p !=
        &local_670.cons1_.cons1_.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_.field_2) {
      operator_delete(local_670.cons1_.cons1_.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_670.cons1_.cons1_.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670.cons1_.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p !=
        &local_670.cons1_.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_.field_2) {
      operator_delete(local_670.cons1_.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_670.cons1_.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p !=
        &local_670.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_.field_2) {
      operator_delete(local_670.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_670.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_._M_dataplus._M_p !=
        &local_850.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
         description_.field_2) {
      operator_delete(local_850.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      _M_dataplus._M_p,
                      local_850.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p !=
        &local_850.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_.field_2) {
      operator_delete(local_850.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_850.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0.cons1_.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p !=
        &local_7b0.cons1_.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_.field_2) {
      operator_delete(local_7b0.cons1_.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_7b0.cons1_.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    paVar3 = &local_7b0.
              super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
              .description_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p != paVar3) {
      operator_delete(local_7b0.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_7b0.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    if (!bVar5) {
      pcVar4 = (this->TorsionAngleConvention).super_ParameterBase.keyword_._M_dataplus._M_p;
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"180_is_trans","");
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_7b0,&local_390);
      local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"0_is_trans","");
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_850,&local_3b0);
      OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_670,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_7b0,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_850);
      paVar1 = &local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                description_.field_2;
      local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
      _M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_8d0,
                 local_670.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p,
                 local_670.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p +
                 local_670.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_string_length);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar4,
               local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_
               ._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p != paVar1) {
        operator_delete(local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670.cons1_.cons1_.cons1_.rhs_._M_dataplus._M_p !=
          &local_670.cons1_.cons1_.cons1_.rhs_.field_2) {
        operator_delete(local_670.cons1_.cons1_.cons1_.rhs_._M_dataplus._M_p,
                        local_670.cons1_.cons1_.cons1_.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670.cons1_.cons1_.cons1_.
             super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_._M_dataplus
             ._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&local_670.cons1_.cons1_.cons1_.
                     super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_ +
             0x10U)) {
        operator_delete(local_670.cons1_.cons1_.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        _M_dataplus._M_p,
                        local_670.cons1_.cons1_.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670.cons1_.cons1_.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_670.cons1_.cons1_.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_670.cons1_.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_670.cons1_.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670.cons1_.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_670.cons1_.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_670.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_670.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_670.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_670.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_670.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_850.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
             description_._M_dataplus._M_p !=
          &local_850.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_.field_2) {
        operator_delete(local_850.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        _M_dataplus._M_p,
                        local_850.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_850.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_850.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_850.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_850.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0.cons1_.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_7b0.cons1_.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_7b0.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_7b0.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p != paVar3) {
        operator_delete(local_7b0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_7b0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2) {
        operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->EAMMixingMethod).super_ParameterBase.empty_ == false) {
    local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"Johnson","");
    isEqualIgnoreCase(&local_8d0,&local_3d0);
    local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"Daw","");
    isEqualIgnoreCase(&local_890,&local_4b0);
    OpenMD::operator||(&local_850,
                       &local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>,
                       &local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"DREAM1","");
    isEqualIgnoreCase(&local_6b0,&local_3f0);
    OpenMD::operator||(&local_7b0,
                       &local_850.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_6b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"DREAM2","");
    isEqualIgnoreCase(&local_490,&local_410);
    OpenMD::operator||(&local_670,
                       &local_7b0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_490.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    pcVar4 = (this->EAMMixingMethod).data_._M_dataplus._M_p;
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_430,pcVar4,pcVar4 + (this->EAMMixingMethod).data_._M_string_length);
    bVar5 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_670,&local_430);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670.cons2_.rhs_._M_dataplus._M_p != &local_670.cons2_.rhs_.field_2) {
      operator_delete(local_670.cons2_.rhs_._M_dataplus._M_p,
                      local_670.cons2_.rhs_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_._M_dataplus._M_p !=
        &local_670.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
         description_.field_2) {
      operator_delete(local_670.cons2_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      _M_dataplus._M_p,
                      local_670.cons2_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      field_2._M_allocated_capacity + 1);
    }
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_670.cons1_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p !=
        &local_670.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_.field_2) {
      operator_delete(local_670.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_670.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490.rhs_._M_dataplus._M_p != &local_490.rhs_.field_2) {
      operator_delete(local_490.rhs_._M_dataplus._M_p,
                      local_490.rhs_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           _M_dataplus._M_p !=
        &local_490.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
         field_2) {
      operator_delete(local_490.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_._M_dataplus._M_p,
                      local_490.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_7b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b0.rhs_._M_dataplus._M_p != &local_6b0.rhs_.field_2) {
      operator_delete(local_6b0.rhs_._M_dataplus._M_p,
                      local_6b0.rhs_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           _M_dataplus._M_p !=
        &local_6b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
         field_2) {
      operator_delete(local_6b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_._M_dataplus._M_p,
                      local_6b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850.cons2_.rhs_._M_dataplus._M_p != &local_850.cons2_.rhs_.field_2) {
      operator_delete(local_850.cons2_.rhs_._M_dataplus._M_p,
                      local_850.cons2_.rhs_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_._M_dataplus._M_p !=
        &local_850.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
         description_.field_2) {
      operator_delete(local_850.cons2_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      _M_dataplus._M_p,
                      local_850.cons2_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850.cons1_.rhs_._M_dataplus._M_p != &local_850.cons1_.rhs_.field_2) {
      operator_delete(local_850.cons1_.rhs_._M_dataplus._M_p,
                      local_850.cons1_.rhs_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_._M_dataplus._M_p !=
        &local_850.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
         description_.field_2) {
      operator_delete(local_850.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      _M_dataplus._M_p,
                      local_850.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p !=
        &local_850.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_.field_2) {
      operator_delete(local_850.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_850.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_890.rhs_._M_dataplus._M_p != &local_890.rhs_.field_2) {
      operator_delete(local_890.rhs_._M_dataplus._M_p,
                      local_890.rhs_.field_2._M_allocated_capacity + 1);
    }
    paVar3 = &local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
              field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           _M_dataplus._M_p != paVar3) {
      operator_delete(local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_._M_dataplus._M_p,
                      local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &local_8d0.rhs_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d0.rhs_._M_dataplus._M_p != paVar1) {
      operator_delete(local_8d0.rhs_._M_dataplus._M_p,
                      local_8d0.rhs_.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
              field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           _M_dataplus._M_p != paVar2) {
      operator_delete(local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_._M_dataplus._M_p,
                      local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
    }
    if (!bVar5) {
      pcVar4 = (this->EAMMixingMethod).super_ParameterBase.keyword_._M_dataplus._M_p;
      local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"Johnson","");
      isEqualIgnoreCase(&local_8d0,&local_4d0);
      local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"Daw","");
      isEqualIgnoreCase(&local_890,&local_4f0);
      OpenMD::operator||(&local_850,
                         &local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>,
                         &local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
      local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"DREAM1","");
      isEqualIgnoreCase(&local_6b0,&local_510);
      OpenMD::operator||(&local_7b0,
                         &local_850.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_6b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>)
      ;
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"DREAM2","");
      isEqualIgnoreCase(&local_490,&local_450);
      OpenMD::operator||(&local_670,
                         &local_7b0.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_490.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>)
      ;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,
                 local_670.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p,
                 local_670.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p +
                 local_670.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_string_length);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar4,local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670.cons2_.rhs_._M_dataplus._M_p != &local_670.cons2_.rhs_.field_2) {
        operator_delete(local_670.cons2_.rhs_._M_dataplus._M_p,
                        local_670.cons2_.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
             description_._M_dataplus._M_p !=
          &local_670.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_.field_2) {
        operator_delete(local_670.cons2_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        _M_dataplus._M_p,
                        local_670.cons2_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        field_2._M_allocated_capacity + 1);
      }
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_670.cons1_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_670.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_670.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_670.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490.rhs_._M_dataplus._M_p != &local_490.rhs_.field_2) {
        operator_delete(local_490.rhs_._M_dataplus._M_p,
                        local_490.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p !=
          &local_490.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           field_2) {
        operator_delete(local_490.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_490.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_7b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b0.rhs_._M_dataplus._M_p != &local_6b0.rhs_.field_2) {
        operator_delete(local_6b0.rhs_._M_dataplus._M_p,
                        local_6b0.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p !=
          &local_6b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           field_2) {
        operator_delete(local_6b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_6b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_850.cons2_.rhs_._M_dataplus._M_p != &local_850.cons2_.rhs_.field_2) {
        operator_delete(local_850.cons2_.rhs_._M_dataplus._M_p,
                        local_850.cons2_.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_850.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
             description_._M_dataplus._M_p !=
          &local_850.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_.field_2) {
        operator_delete(local_850.cons2_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        _M_dataplus._M_p,
                        local_850.cons2_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_850.cons1_.rhs_._M_dataplus._M_p != &local_850.cons1_.rhs_.field_2) {
        operator_delete(local_850.cons1_.rhs_._M_dataplus._M_p,
                        local_850.cons1_.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_850.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
             description_._M_dataplus._M_p !=
          &local_850.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_.field_2) {
        operator_delete(local_850.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        _M_dataplus._M_p,
                        local_850.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_850.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_850.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_850.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_850.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_890.rhs_._M_dataplus._M_p != &local_890.rhs_.field_2) {
        operator_delete(local_890.rhs_._M_dataplus._M_p,
                        local_890.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p != paVar3) {
        operator_delete(local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_890.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
        operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8d0.rhs_._M_dataplus._M_p != paVar1) {
        operator_delete(local_8d0.rhs_._M_dataplus._M_p,
                        local_8d0.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p != paVar2) {
        operator_delete(local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_8d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void validateOptions() {
      CheckParameter(vdWtype, isEqualIgnoreCase(std::string("Lennard-Jones")));
      CheckParameter(DistanceMixingRule,
                     isEqualIgnoreCase(std::string("arithmetic")) ||
                         isEqualIgnoreCase(std::string("geometric")) ||
                         isEqualIgnoreCase(std::string("cubic")));
      CheckParameter(DistanceType, isEqualIgnoreCase(std::string("sigma")) ||
                                       isEqualIgnoreCase(std::string("Rmin")));
      CheckParameter(EnergyMixingRule,
                     isEqualIgnoreCase(std::string("arithmetic")) ||
                         isEqualIgnoreCase(std::string("geometric")) ||
                         isEqualIgnoreCase(std::string("hhg")));
      CheckParameter(TorsionAngleConvention,
                     isEqualIgnoreCase(std::string("180_is_trans")) ||
                         isEqualIgnoreCase(std::string("0_is_trans")));
      CheckParameter(EAMMixingMethod,
                     isEqualIgnoreCase(std::string("Johnson")) ||
                         isEqualIgnoreCase(std::string("Daw")) ||
                         isEqualIgnoreCase(std::string("DREAM1")) ||
                         isEqualIgnoreCase(std::string("DREAM2")));
    }